

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Block * __thiscall SQCompilation::SQParser::parseStatements(SQParser *this)

{
  long lVar1;
  Block *this_00;
  Statement *stmt;
  NestingChecker nc;
  NestingChecker local_20;
  
  NestingChecker::NestingChecker(&local_20,this);
  this_00 = newNode<SQCompilation::Block,Arena*>(this,this->_astArena);
  while ((1 < this->_token - 300U && (this->_token != 0x7d))) {
    stmt = parseStatement(this,false);
    Block::addStatement(this_00,stmt);
    lVar1 = (this->_lex)._prevtoken;
    if ((lVar1 != 0x3b) && (lVar1 != 0x7d)) {
      OptionalSemicolon(this);
    }
  }
  (local_20._p)->_depth = (local_20._p)->_depth - local_20._depth;
  return this_00;
}

Assistant:

Block* SQParser::parseStatements()
{
    NestingChecker nc(this);
    Block *result = newNode<Block>(arena());
    while(_token != _SC('}') && _token != TK_DEFAULT && _token != TK_CASE) {
        Statement *stmt = parseStatement();
        result->addStatement(stmt);
        if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
    }
    return result;
}